

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_importSource_Test::Clone_importSource_Test(Clone_importSource_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00116c98;
  return;
}

Assistant:

TEST(Clone, importSource)
{
    auto i = libcellml::ImportSource::create();

    i->setId("import");
    i->setUrl("this_is_a_url");

    auto iClone = i->clone();

    EXPECT_EQ(i->id(), iClone->id());
    EXPECT_EQ(i->url(), iClone->url());
    EXPECT_EQ(i->hasModel(), iClone->hasModel());
}